

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O3

int ov_crosslap(OggVorbis_File *vf1,OggVorbis_File *vf2)

{
  long lVar1;
  vorbis_dsp_state *vd;
  int lapsize;
  int n2;
  int iVar2;
  int iVar3;
  vorbis_info *vi;
  ulong uVar4;
  bool bVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  long lVar6;
  float **ppfVar7;
  vorbis_info *pvVar8;
  float **lappcm;
  byte bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  float *apfStack_80 [2];
  float **local_70;
  float **pcm;
  float *local_60;
  vorbis_dsp_state *local_58;
  vorbis_info *local_50;
  int local_44;
  vorbis_info *local_40;
  int local_34;
  long lVar12;
  
  if (vf1 == vf2) {
    iVar2 = 0;
  }
  else {
    iVar2 = -0x83;
    if ((1 < vf1->ready_state) && (1 < vf2->ready_state)) {
      do {
        if (vf1->ready_state == 4) {
          apfStack_80[0] = (float *)0x1aa49d;
          iVar2 = _ov_initprime(vf2);
          if (iVar2 != 0) {
            return iVar2;
          }
          if (vf1->seekable == 0) {
            pvVar8 = vf1->vi;
            local_40 = pvVar8;
          }
          else {
            pvVar8 = vf1->vi;
            local_40 = pvVar8;
            if (2 < vf1->ready_state) {
              local_40 = pvVar8 + vf1->current_link;
            }
          }
          if (vf2->seekable == 0) {
            vi = vf2->vi;
            local_50 = vi;
          }
          else {
            vi = vf2->vi;
            local_50 = vi;
            if (2 < vf2->ready_state) {
              local_50 = vi + vf2->current_link;
            }
          }
          iVar2 = -0x82;
          bVar9 = 0x7e;
          if (pvVar8 != (vorbis_info *)0x0) {
            apfStack_80[0] = (float *)0x1aa51c;
            iVar3 = vorbis_synthesis_halfrate_p(pvVar8);
            bVar9 = (char)iVar3 + 1;
            vi = vf2->vi;
          }
          if (vi != (vorbis_info *)0x0) {
            apfStack_80[0] = (float *)0x1aa533;
            iVar2 = vorbis_synthesis_halfrate_p(vi);
            iVar2 = iVar2 + 1;
          }
          pvVar8 = local_40;
          lVar1 = -((long)local_40->channels * 8 + 0xfU & 0xfffffffffffffff0);
          lappcm = (float **)((long)apfStack_80 + lVar1 + 8);
          local_34 = iVar2;
          *(undefined8 *)((long)apfStack_80 + lVar1) = 0x1aa56b;
          local_44 = vorbis_info_blocksize(pvVar8,0);
          pvVar8 = local_50;
          local_44 = local_44 >> (bVar9 & 0x1f);
          *(undefined8 *)((long)apfStack_80 + lVar1) = 0x1aa57e;
          iVar2 = vorbis_info_blocksize(pvVar8,0);
          local_34 = iVar2 >> ((byte)local_34 & 0x1f);
          local_58 = &vf1->vd;
          *(undefined8 *)((long)apfStack_80 + lVar1) = 0x1aa59b;
          pcm = (float **)vorbis_window(&vf1->vd,0);
          *(undefined8 *)((long)apfStack_80 + lVar1) = 0x1aa5ac;
          local_60 = vorbis_window(&vf2->vd,0);
          iVar2 = local_40->channels;
          ppfVar7 = lappcm;
          if (0 < (long)iVar2) {
            lVar6 = (long)iVar2 + -1;
            auVar10._8_4_ = (int)lVar6;
            auVar10._0_8_ = lVar6;
            auVar10._12_4_ = (int)((ulong)lVar6 >> 0x20);
            lVar6 = 0;
            auVar10 = auVar10 ^ _DAT_001e8190;
            uVar4 = (long)local_44 * 4 + 0xfU & 0xfffffffffffffff0;
            auVar11 = _DAT_001e8180;
            do {
              auVar13 = auVar11 ^ _DAT_001e8190;
              if ((bool)(~(auVar13._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar13._0_4_ ||
                          auVar10._4_4_ < auVar13._4_4_) & 1)) {
                ppfVar7 = (float **)((long)ppfVar7 - uVar4);
                *(float ***)((long)lappcm + lVar6) = ppfVar7;
              }
              if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
                  auVar13._12_4_ <= auVar10._12_4_) {
                ppfVar7 = (float **)((long)ppfVar7 + -uVar4);
                *(float ***)((long)&local_70 + lVar6 + lVar1) = ppfVar7;
              }
              lVar12 = auVar11._8_8_;
              auVar11._0_8_ = auVar11._0_8_ + 2;
              auVar11._8_8_ = lVar12 + 2;
              lVar6 = lVar6 + 0x10;
            } while ((ulong)(iVar2 + 1U >> 1) << 4 != lVar6);
          }
          pvVar8 = local_40;
          lapsize = local_44;
          vd = local_58;
          ppfVar7[-1] = (float *)0x1aa68f;
          _ov_getlap(vf1,pvVar8,vd,lappcm,lapsize);
          ppfVar7[-1] = (float *)0x1aa69e;
          vorbis_synthesis_lapout(&vf2->vd,&local_70);
          n2 = local_34;
          iVar2 = pvVar8->channels;
          iVar3 = local_50->channels;
          ppfVar7[-1] = local_60;
          ppfVar7[-2] = (float *)pcm;
          ppfVar7[-3] = (float *)0x1aa6c1;
          _ov_splice(local_70,lappcm,lapsize,n2,iVar2,iVar3,ppfVar7[-2],ppfVar7[-1]);
          return 0;
        }
        apfStack_80[0] = (float *)0x1aa46b;
        iVar2 = _fetch_and_process_packet(vf1,(ogg_packet *)0x0,(int)in_RDX,(int)in_RCX);
        bVar5 = iVar2 == -3 || -1 < iVar2;
        in_RCX = CONCAT71((int7)((ulong)in_RCX >> 8),bVar5);
        in_RDX = extraout_RDX;
      } while (bVar5);
    }
  }
  return iVar2;
}

Assistant:

int ov_crosslap(OggVorbis_File *vf1, OggVorbis_File *vf2){
  vorbis_info *vi1,*vi2;
  float **lappcm;
  float **pcm;
  const float *w1,*w2;
  int n1,n2,i,ret,hs1,hs2;

  if(vf1==vf2)return(0); /* degenerate case */
  if(vf1->ready_state<OPENED)return(OV_EINVAL);
  if(vf2->ready_state<OPENED)return(OV_EINVAL);

  /* the relevant overlap buffers must be pre-checked and pre-primed
     before looking at settings in the event that priming would cross
     a bitstream boundary.  So, do it now */

  ret=_ov_initset(vf1);
  if(ret)return(ret);
  ret=_ov_initprime(vf2);
  if(ret)return(ret);

  vi1=ov_info(vf1,-1);
  vi2=ov_info(vf2,-1);
  hs1=ov_halfrate_p(vf1);
  hs2=ov_halfrate_p(vf2);

  lappcm=alloca(sizeof(*lappcm)*vi1->channels);
  n1=vorbis_info_blocksize(vi1,0)>>(1+hs1);
  n2=vorbis_info_blocksize(vi2,0)>>(1+hs2);
  w1=vorbis_window(&vf1->vd,0);
  w2=vorbis_window(&vf2->vd,0);

  for(i=0;i<vi1->channels;i++)
    lappcm[i]=alloca(sizeof(**lappcm)*n1);

  _ov_getlap(vf1,vi1,&vf1->vd,lappcm,n1);

  /* have a lapping buffer from vf1; now to splice it into the lapping
     buffer of vf2 */
  /* consolidate and expose the buffer. */
  vorbis_synthesis_lapout(&vf2->vd,&pcm);

#if 0
  _analysis_output_always("pcmL",0,pcm[0],n1*2,0,0,0);
  _analysis_output_always("pcmR",0,pcm[1],n1*2,0,0,0);
#endif

  /* splice */
  _ov_splice(pcm,lappcm,n1,n2,vi1->channels,vi2->channels,w1,w2);

  /* done */
  return(0);
}